

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::ContainerPrinter::PrintValue<bssl::Span<int>,void>
               (Span<int> *container,ostream *os)

{
  iterator piVar1;
  int *elem;
  iterator __end0;
  iterator __begin0;
  Span<int> *__range3;
  size_t count;
  size_t kMaxCount;
  ostream *os_local;
  Span<int> *container_local;
  
  std::operator<<(os,'{');
  __range3 = (Span<int> *)0x0;
  __end0 = bssl::Span<int>::begin(container);
  piVar1 = bssl::Span<int>::end(container);
  do {
    if (__end0 == piVar1) {
LAB_004a2257:
      if (__range3 != (Span<int> *)0x0) {
        std::operator<<(os,' ');
      }
      std::operator<<(os,'}');
      return;
    }
    if ((__range3 != (Span<int> *)0x0) && (std::operator<<(os,','), __range3 == (Span<int> *)0x20))
    {
      std::operator<<(os," ...");
      goto LAB_004a2257;
    }
    std::operator<<(os,' ');
    UniversalPrint<int>(__end0,os);
    __range3 = (Span<int> *)((long)&__range3->data_ + 1);
    __end0 = __end0 + 1;
  } while( true );
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }